

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O1

int __thiscall
ncnn::Slice::forward
          (Slice *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  Mat *pMVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint _c;
  pointer pMVar5;
  size_t _elemsize;
  void *pvVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  pointer pMVar11;
  int iVar12;
  void *pvVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  void *pvVar19;
  void *__src;
  bool bVar20;
  int local_c0;
  ulong local_a0;
  
  pMVar5 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = pMVar5->dims;
  _elemsize = pMVar5->elemsize;
  pvVar6 = (this->slices).data;
  if (uVar2 == 1) {
    pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar11;
    if (lVar9 != 0) {
      iVar8 = pMVar5->w;
      uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
      lVar15 = 0;
      lVar9 = 0;
      iVar18 = 0;
      uVar14 = 0;
      do {
        iVar16 = *(int *)((long)pvVar6 + uVar14 * 4);
        if (iVar16 == -0xe9) {
          iVar16 = (int)((ulong)((long)iVar8 - (long)iVar18) / (uVar10 + lVar9));
        }
        Mat::create((Mat *)((long)&pMVar11->data + lVar15),iVar16,_elemsize,opt->blob_allocator);
        pvVar13 = *(void **)((long)&pMVar11->data + lVar15);
        if (pvVar13 == (void *)0x0) {
          bVar20 = true;
        }
        else {
          bVar20 = (long)*(int *)((long)&pMVar11->c + lVar15) *
                   *(long *)((long)&pMVar11->cstep + lVar15) == 0;
        }
        if (bVar20) {
          return -100;
        }
        memcpy(pvVar13,(void *)(_elemsize * (long)iVar18 + (long)pMVar5->data),
               (long)iVar16 * _elemsize);
        iVar18 = iVar18 + iVar16;
        uVar14 = uVar14 + 1;
        pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                 -0x71c71c71c71c71c7;
        lVar9 = lVar9 + -1;
        lVar15 = lVar15 + 0x48;
      } while (uVar14 < uVar10);
    }
  }
  else {
    iVar8 = (this->axis >> 0x1f & uVar2) + this->axis;
    if ((uVar2 == 2) && (iVar8 == 0)) {
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar9 != 0) {
        iVar8 = pMVar5->w;
        iVar18 = pMVar5->h;
        uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
        lVar15 = 0;
        lVar9 = 0;
        iVar16 = 0;
        uVar14 = 0;
        do {
          iVar7 = *(int *)((long)pvVar6 + uVar14 * 4);
          if (iVar7 == -0xe9) {
            iVar7 = (int)((ulong)((long)iVar18 - (long)iVar16) / (uVar10 + lVar9));
          }
          Mat::create((Mat *)((long)&pMVar11->data + lVar15),iVar8,iVar7,_elemsize,
                      opt->blob_allocator);
          pvVar13 = *(void **)((long)&pMVar11->data + lVar15);
          if (pvVar13 == (void *)0x0) {
            bVar20 = true;
          }
          else {
            bVar20 = (long)*(int *)((long)&pMVar11->c + lVar15) *
                     *(long *)((long)&pMVar11->cstep + lVar15) == 0;
          }
          if (bVar20) {
            return -100;
          }
          memcpy(pvVar13,(void *)((long)pMVar5->w * (long)iVar16 * pMVar5->elemsize +
                                 (long)pMVar5->data),(long)(iVar7 * iVar8) * _elemsize);
          iVar16 = iVar16 + iVar7;
          uVar14 = uVar14 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   -0x71c71c71c71c71c7;
          lVar9 = lVar9 + -1;
          lVar15 = lVar15 + 0x48;
        } while (uVar14 < uVar10);
      }
    }
    else {
      if ((uVar2 != 2) || (iVar8 != 1)) {
        if ((uVar2 - 3 < 2) && (iVar8 == 0)) {
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar9 == 0) {
            return 0;
          }
          iVar8 = pMVar5->w;
          iVar18 = pMVar5->h;
          iVar16 = pMVar5->d;
          iVar7 = pMVar5->c;
          uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
          lVar15 = 0;
          lVar9 = 0;
          local_c0 = 0;
          uVar14 = 0;
          while( true ) {
            iVar12 = *(int *)((long)pvVar6 + uVar14 * 4);
            if (iVar12 == -0xe9) {
              iVar12 = (int)((ulong)((long)iVar7 - (long)local_c0) / (uVar10 + lVar9));
            }
            Mat::create((Mat *)((long)&pMVar11->data + lVar15),iVar8,iVar18,iVar16,iVar12,_elemsize,
                        opt->blob_allocator);
            if (*(long *)((long)&pMVar11->data + lVar15) == 0) {
              bVar20 = true;
            }
            else {
              bVar20 = (long)*(int *)((long)&pMVar11->c + lVar15) *
                       *(long *)((long)&pMVar11->cstep + lVar15) == 0;
            }
            if (bVar20) break;
            *(uint *)((long)&pMVar11->dims + lVar15) = uVar2;
            memcpy(*(void **)((long)&pMVar11->data + lVar15),
                   (void *)(pMVar5->cstep * (long)local_c0 * pMVar5->elemsize + (long)pMVar5->data),
                   (long)(iVar12 * (int)pMVar5->cstep) * _elemsize);
            local_c0 = local_c0 + iVar12;
            uVar14 = uVar14 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                     -0x71c71c71c71c71c7;
            lVar9 = lVar9 + -1;
            lVar15 = lVar15 + 0x48;
            if (uVar10 <= uVar14) {
              return 0;
            }
          }
        }
        else if (((uVar2 == 3) && (iVar8 == 1)) || ((uVar2 == 4 && (iVar8 == 2)))) {
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar9 == 0) {
            return 0;
          }
          iVar8 = pMVar5->w;
          uVar3 = pMVar5->d;
          iVar18 = pMVar5->h;
          uVar4 = pMVar5->c;
          uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
          iVar16 = 0;
          uVar14 = 0;
          while( true ) {
            iVar7 = *(int *)((long)pvVar6 + uVar14 * 4);
            if (iVar7 == -0xe9) {
              iVar7 = (int)((ulong)((long)iVar18 - (long)iVar16) / (uVar10 - uVar14));
            }
            pMVar1 = pMVar11 + uVar14;
            Mat::create(pMVar1,iVar8,iVar7,uVar3,uVar4,_elemsize,opt->blob_allocator);
            if (pMVar1->data == (void *)0x0) {
              bVar20 = true;
            }
            else {
              bVar20 = (long)pMVar1->c * pMVar1->cstep == 0;
            }
            if (!bVar20) {
              pMVar1->dims = uVar2;
              if (0 < (int)uVar4) {
                uVar10 = 0;
                do {
                  if (0 < (int)uVar3) {
                    uVar17 = 0;
                    do {
                      lVar9 = (long)pMVar5->w * pMVar5->elemsize;
                      memcpy((void *)((long)pMVar1->data +
                                     (long)pMVar1->h * pMVar1->elemsize * (long)pMVar1->w * uVar17 +
                                     pMVar1->cstep * uVar10 * pMVar1->elemsize),
                             (void *)((long)pMVar5->data +
                                     lVar9 * iVar16 + (long)pMVar5->h * uVar17 * lVar9 +
                                     pMVar5->cstep * uVar10 * pMVar5->elemsize),
                             (long)(iVar7 * iVar8) * _elemsize);
                      uVar17 = uVar17 + 1;
                    } while (uVar3 != uVar17);
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar10 != uVar4);
              }
              iVar16 = iVar16 + iVar7;
            }
            if (bVar20) break;
            uVar14 = uVar14 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                     -0x71c71c71c71c71c7;
            if (uVar10 <= uVar14) {
              return 0;
            }
          }
        }
        else if ((uVar2 == 3 && iVar8 == 2) || (iVar8 == 3 && uVar2 == 4)) {
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar9 == 0) {
            return 0;
          }
          iVar8 = pMVar5->w;
          uVar3 = pMVar5->h;
          uVar4 = pMVar5->d;
          _c = pMVar5->c;
          uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
          uVar14 = 0;
          iVar18 = 0;
          while( true ) {
            iVar16 = *(int *)((long)pvVar6 + uVar14 * 4);
            if (iVar16 == -0xe9) {
              iVar16 = (int)((ulong)((long)iVar8 - (long)iVar18) / (uVar10 - uVar14));
            }
            pMVar1 = pMVar11 + uVar14;
            Mat::create(pMVar1,iVar16,uVar3,uVar4,_c,_elemsize,opt->blob_allocator);
            if (pMVar1->data == (void *)0x0) {
              bVar20 = true;
            }
            else {
              bVar20 = (long)pMVar1->c * pMVar1->cstep == 0;
            }
            if (!bVar20) {
              pMVar1->dims = uVar2;
              if (0 < (int)_c) {
                local_a0 = 0;
                do {
                  if (0 < (int)uVar4) {
                    iVar7 = pMVar5->h;
                    pvVar13 = (void *)(pMVar1->cstep * local_a0 * pMVar1->elemsize +
                                      (long)pMVar1->data);
                    lVar9 = (long)pMVar5->w * pMVar5->elemsize;
                    pvVar19 = (void *)((long)pMVar5->data +
                                      pMVar5->elemsize * pMVar5->cstep * local_a0 +
                                      (long)iVar18 * _elemsize);
                    uVar10 = 0;
                    do {
                      uVar17 = (ulong)uVar3;
                      __src = pvVar19;
                      if (0 < (int)uVar3) {
                        do {
                          memcpy(pvVar13,__src,(long)iVar16 * _elemsize);
                          pvVar13 = (void *)((long)pvVar13 + (long)iVar16 * _elemsize);
                          __src = (void *)((long)__src + lVar9);
                          uVar17 = uVar17 - 1;
                        } while (uVar17 != 0);
                      }
                      uVar10 = uVar10 + 1;
                      pvVar19 = (void *)((long)pvVar19 + iVar7 * lVar9);
                    } while (uVar10 != uVar4);
                  }
                  local_a0 = local_a0 + 1;
                } while (local_a0 != _c);
              }
              iVar18 = iVar18 + iVar16;
            }
            if (bVar20) break;
            uVar14 = uVar14 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                     -0x71c71c71c71c71c7;
            if (uVar10 <= uVar14) {
              return 0;
            }
          }
        }
        else {
          if (uVar2 != 4) {
            return 0;
          }
          if (iVar8 != 1) {
            return 0;
          }
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11;
          if (lVar9 == 0) {
            return 0;
          }
          iVar18 = pMVar5->w;
          iVar16 = pMVar5->h;
          iVar7 = pMVar5->d;
          uVar2 = pMVar5->c;
          uVar10 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
          uVar14 = 0;
          iVar8 = 0;
          while( true ) {
            iVar12 = *(int *)((long)pvVar6 + uVar14 * 4);
            if (iVar12 == -0xe9) {
              iVar12 = (int)((ulong)((long)iVar7 - (long)iVar8) / (uVar10 - uVar14));
            }
            pMVar1 = pMVar11 + uVar14;
            Mat::create(pMVar1,iVar18,iVar16,iVar12,uVar2,_elemsize,opt->blob_allocator);
            if (pMVar1->data == (void *)0x0) {
              bVar20 = true;
            }
            else {
              bVar20 = (long)pMVar1->c * pMVar1->cstep == 0;
            }
            if (!bVar20) {
              if (0 < (int)uVar2) {
                uVar10 = 0;
                do {
                  memcpy((void *)(pMVar1->cstep * uVar10 * pMVar1->elemsize + (long)pMVar1->data),
                         (void *)((long)pMVar5->data +
                                 (long)pMVar5->h * pMVar5->elemsize * (long)pMVar5->w * (long)iVar8
                                 + pMVar5->cstep * uVar10 * pMVar5->elemsize),
                         (long)(iVar16 * iVar18 * iVar12) * _elemsize);
                  uVar10 = uVar10 + 1;
                } while (uVar2 != uVar10);
              }
              iVar8 = iVar8 + iVar12;
            }
            if (bVar20) break;
            uVar14 = uVar14 + 1;
            pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                      .super__Vector_impl_data._M_start;
            uVar10 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                     -0x71c71c71c71c71c7;
            if (uVar10 <= uVar14) {
              return 0;
            }
          }
        }
        return -100;
      }
      pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)pMVar11;
      if (lVar9 != 0) {
        iVar8 = pMVar5->w;
        uVar2 = pMVar5->h;
        uVar14 = (lVar9 >> 3) * -0x71c71c71c71c71c7;
        iVar18 = 0;
        uVar10 = 0;
        do {
          iVar16 = *(int *)((long)pvVar6 + uVar10 * 4);
          if (iVar16 == -0xe9) {
            iVar16 = (int)((ulong)((long)iVar8 - (long)iVar18) / (uVar14 - uVar10));
          }
          pMVar1 = pMVar11 + uVar10;
          Mat::create(pMVar1,iVar16,uVar2,_elemsize,opt->blob_allocator);
          if (pMVar1->data == (void *)0x0) {
            bVar20 = true;
          }
          else {
            bVar20 = (long)pMVar1->c * pMVar1->cstep == 0;
          }
          if (!bVar20) {
            if (0 < (int)uVar2) {
              uVar14 = 0;
              do {
                memcpy((void *)((long)pMVar1->w * uVar14 * pMVar1->elemsize + (long)pMVar1->data),
                       (void *)((long)pMVar5->data +
                               (long)iVar18 * _elemsize +
                               (long)pMVar5->w * uVar14 * pMVar5->elemsize),(long)iVar16 * _elemsize
                      );
                uVar14 = uVar14 + 1;
              } while (uVar2 != uVar14);
            }
            iVar18 = iVar18 + iVar16;
          }
          if (bVar20) {
            return -100;
          }
          uVar10 = uVar10 + 1;
          pMVar11 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          uVar14 = ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                   -0x71c71c71c71c71c7;
        } while (uVar10 < uVar14);
      }
    }
  }
  return 0;
}

Assistant:

int Slice::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    const int* slices_ptr = slices;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1) // positive_axis == 0
    {
        int w = bottom_blob.w;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const unsigned char* ptr = (const unsigned char*)bottom_blob + q * elemsize;
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, slice * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            int size = w * slice;

            const unsigned char* ptr = bottom_blob.row<const unsigned char>(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int j = 0; j < h; j++)
            {
                unsigned char* outptr = top_blob.row<unsigned char>(j);
                const unsigned char* ptr = bottom_blob.row<const unsigned char>(j) + q * elemsize;
                memcpy(outptr, ptr, slice * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 || dims == 4) && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((channels - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, d, slice, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            int size = static_cast<int>(bottom_blob.cstep * slice);

            const unsigned char* ptr = bottom_blob.channel(q);
            unsigned char* outptr = top_blob;
            memcpy(outptr, ptr, size * elemsize);

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 1) || (dims == 4 && positive_axis == 2))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((h - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, slice, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                for (int j = 0; j < d; j++)
                {
                    int size = w * slice;

                    unsigned char* outptr = top_blob.channel(p).depth(j);
                    const unsigned char* ptr = bottom_blob.channel(p).depth(j).row<const unsigned char>(q);
                    memcpy(outptr, ptr, size * elemsize);
                }
            }

            q += slice;
        }

        return 0;
    }

    if ((dims == 3 && positive_axis == 2) || (dims == 4 && positive_axis == 3))
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((w - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(slice, h, d, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            top_blob.dims = dims;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                unsigned char* outptr = top_blob.channel(p);
                const Mat m = bottom_blob.channel(p);

                for (int j = 0; j < d; j++)
                {
                    for (int k = 0; k < h; k++)
                    {
                        const unsigned char* ptr = m.depth(j).row<const unsigned char>(k) + q * elemsize;
                        memcpy(outptr, ptr, slice * elemsize);

                        outptr += slice * elemsize;
                    }
                }
            }

            q += slice;
        }

        return 0;
    }

    if (dims == 4 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int d = bottom_blob.d;
        int channels = bottom_blob.c;

        int q = 0;
        for (size_t i = 0; i < top_blobs.size(); i++)
        {
            int slice = slices_ptr[i];
            if (slice == -233)
            {
                slice = static_cast<int>((d - q) / (top_blobs.size() - i));
            }

            Mat& top_blob = top_blobs[i];
            top_blob.create(w, h, slice, channels, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < channels; p++)
            {
                int size = w * h * slice;

                unsigned char* outptr = top_blob.channel(p);
                const unsigned char* ptr = bottom_blob.channel(p).depth(q);
                memcpy(outptr, ptr, size * elemsize);
            }

            q += slice;
        }

        return 0;
    }

    return 0;
}